

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void do_pick(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  OBJ_DATA *pOVar6;
  ulong uVar7;
  char *format;
  long in_RDI;
  __type_conflict2 _Var8;
  EXIT_DATA *pexit_rev;
  ROOM_INDEX_DATA *to_room;
  EXIT_DATA *pexit;
  int door;
  OBJ_DATA *obj;
  CHAR_DATA *gch;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffed70;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffed78;
  CHAR_DATA *ch_01;
  CHAR_DATA *in_stack_ffffffffffffed80;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  CHAR_DATA *local_1220;
  char local_1218;
  int in_stack_ffffffffffffee44;
  undefined1 in_stack_ffffffffffffee4b;
  int in_stack_ffffffffffffee4c;
  CHAR_DATA *in_stack_ffffffffffffee50;
  int in_stack_ffffffffffffee6c;
  CHAR_DATA *in_stack_ffffffffffffee70;
  
  one_argument(in_stack_ffffffffffffed70,(char *)in_stack_ffffffffffffed68);
  if (local_1218 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
  }
  else {
    WAIT_STATE(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20));
    for (local_1220 = *(CHAR_DATA **)(*(long *)(in_RDI + 0xa8) + 0x18);
        local_1220 != (CHAR_DATA *)0x0; local_1220 = local_1220->next_in_room) {
      bVar3 = is_npc(in_stack_ffffffffffffed68);
      if (((bVar3) && (bVar3 = is_awake(local_1220), bVar3)) &&
         (*(short *)(in_RDI + 0x138) + 5 < (int)local_1220->level)) {
        act((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
            in_stack_ffffffffffffed68,0);
        return;
      }
    }
    bVar3 = is_npc(in_stack_ffffffffffffed68);
    if (!bVar3) {
      iVar4 = number_percent();
      iVar5 = get_skill(in_stack_ffffffffffffee70,in_stack_ffffffffffffee6c);
      if (iVar5 < iVar4) {
        send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                      (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
        return;
      }
    }
    pOVar6 = get_obj_here(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
    if (pOVar6 == (OBJ_DATA *)0x0) {
      iVar4 = find_door(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
      if (-1 < iVar4) {
        plVar1 = *(long **)(*(long *)(in_RDI + 0xa8) + 0x38 + (long)iVar4 * 8);
        ch_01 = (CHAR_DATA *)plVar1[1];
        _Var8 = std::pow<int,int>(0,0x561eeb);
        if ((((ulong)ch_01 & (long)_Var8) != 0) ||
           (bVar3 = is_immortal(in_stack_ffffffffffffed68), bVar3)) {
          if ((-1 < (short)plVar1[3]) || (bVar3 = is_immortal(in_stack_ffffffffffffed68), bVar3)) {
            arg1 = (void *)plVar1[1];
            _Var8 = std::pow<int,int>(0,0x561f7a);
            if (((ulong)arg1 & (long)_Var8) == 0) {
              send_to_char((char *)in_stack_ffffffffffffed80,ch_01);
            }
            else {
              ch_00 = (CHAR_DATA *)plVar1[1];
              _Var8 = std::pow<int,int>(0,0x561fc2);
              if ((((ulong)ch_00 & (long)_Var8) == 0) || (bVar3 = is_immortal(ch_00), bVar3)) {
                _Var8 = std::pow<int,int>(0,0x56200a);
                plVar1[1] = ((long)_Var8 ^ 0xffffffffffffffffU) & plVar1[1];
                send_to_char((char *)in_stack_ffffffffffffed80,ch_01);
                act((char *)in_stack_ffffffffffffed80,ch_01,arg1,ch_00,0);
                check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                              (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
                plVar2 = *(long **)(*plVar1 + 0x38 + (long)rev_dir[iVar4] * 8);
                if ((*plVar1 != 0) &&
                   ((plVar2 != (long *)0x0 && (*plVar2 == *(long *)(in_RDI + 0xa8))))) {
                  _Var8 = std::pow<int,int>(0,0x5620db);
                  plVar2[1] = ((long)_Var8 ^ 0xffffffffffffffffU) & plVar2[1];
                }
              }
              else {
                send_to_char((char *)in_stack_ffffffffffffed80,ch_01);
              }
            }
          }
          else {
            send_to_char((char *)in_stack_ffffffffffffed80,ch_01);
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffed80,ch_01);
        }
      }
    }
    else if (pOVar6->item_type == 0x1d) {
      uVar7 = (ulong)pOVar6->value[1];
      _Var8 = std::pow<int,int>(0,0x561b45);
      if ((uVar7 & (long)_Var8) == 0) {
        send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      }
      else {
        uVar7 = (ulong)pOVar6->value[1];
        _Var8 = std::pow<int,int>(0,0x561b91);
        if ((uVar7 & (long)_Var8) == 0) {
          send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        }
        else if (pOVar6->value[4] < 0) {
          send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        }
        else {
          iVar4 = pOVar6->value[1];
          _Var8 = std::pow<int,int>(0,0x561c04);
          if (((long)iVar4 & (long)_Var8) == 0) {
            _Var8 = std::pow<int,int>(0,0x561c3c);
            pOVar6->value[1] = pOVar6->value[1] & ((uint)(long)_Var8 ^ 0xffffffff);
            act((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,
                in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,0);
            act((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,
                in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,0);
            check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                          (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
          }
          else {
            send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
          }
        }
      }
    }
    else if (pOVar6->item_type == 0xf) {
      iVar4 = pOVar6->value[1];
      _Var8 = std::pow<int,int>(0,0x561d0a);
      if (((long)iVar4 & (long)_Var8) == 0) {
        send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      }
      else if (pOVar6->value[2] < 0) {
        send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      }
      else {
        iVar4 = pOVar6->value[1];
        _Var8 = std::pow<int,int>(0,0x561d7d);
        if (((long)iVar4 & (long)_Var8) == 0) {
          send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        }
        else {
          format = (char *)(long)pOVar6->value[1];
          _Var8 = std::pow<int,int>(0,0x561dc9);
          if (((ulong)format & (long)_Var8) == 0) {
            _Var8 = std::pow<int,int>(0,0x561e04);
            pOVar6->value[1] = pOVar6->value[1] & ((uint)(long)_Var8 ^ 0xffffffff);
            act(format,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68
                ,0);
            act(format,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68
                ,0);
            check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                          (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
          }
          else {
            send_to_char(format,in_stack_ffffffffffffed78);
          }
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
    }
  }
  return;
}

Assistant:

void do_pick(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Pick what?\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[gsn_pick_lock].beats);

	/* look for guards */
	for (auto gch = ch->in_room->people; gch; gch = gch->next_in_room)
	{
		if (is_npc(gch) && is_awake(gch) && ch->level + 5 < gch->level)
		{
			act("$N is standing too close to the lock.", ch, nullptr, gch, TO_CHAR);
			return;
		}
	}

	if (!is_npc(ch) && number_percent() > get_skill(ch, gsn_pick_lock))
	{
		send_to_char("You failed.\n\r", ch);
		check_improve(ch, gsn_pick_lock, false, 2);
		return;
	}

	auto obj = get_obj_here(ch, arg);
	if (obj != nullptr)
	{
		/* portal stuff */
		if (obj->item_type == ITEM_PORTAL)
		{
			if (!IS_SET_OLD(obj->value[1], EX_ISDOOR))
			{
				send_to_char("You can't do that.\n\r", ch);
				return;
			}

			if (!IS_SET_OLD(obj->value[1], EX_CLOSED))
			{
				send_to_char("It's not closed.\n\r", ch);
				return;
			}

			if (obj->value[4] < 0)
			{
				send_to_char("It can't be unlocked.\n\r", ch);
				return;
			}

			if (IS_SET_OLD(obj->value[1], EX_PICKPROOF))
			{
				send_to_char("You failed.\n\r", ch);
				return;
			}

			REMOVE_BIT_OLD(obj->value[1], EX_LOCKED);

			act("You pick the lock on $p.", ch, obj, nullptr, TO_CHAR);
			act("$n picks the lock on $p.", ch, obj, nullptr, TO_ROOM);
			check_improve(ch, gsn_pick_lock, true, 2);
			return;
		}

		/* 'pick object' */
		if (obj->item_type != ITEM_CONTAINER)
		{
			send_to_char("That's not a container.\n\r", ch);
			return;
		}

		if (!IS_SET_OLD(obj->value[1], CONT_CLOSED))
		{
			send_to_char("It's not closed.\n\r", ch);
			return;
		}

		if (obj->value[2] < 0)
		{
			send_to_char("It can't be unlocked.\n\r", ch);
			return;
		}

		if (!IS_SET_OLD(obj->value[1], CONT_LOCKED))
		{
			send_to_char("It's already unlocked.\n\r", ch);
			return;
		}

		if (IS_SET_OLD(obj->value[1], CONT_PICKPROOF))
		{
			send_to_char("You failed.\n\r", ch);
			return;
		}

		REMOVE_BIT_OLD(obj->value[1], CONT_LOCKED);

		act("You pick the lock on $p.", ch, obj, nullptr, TO_CHAR);
		act("$n picks the lock on $p.", ch, obj, nullptr, TO_ROOM);
		check_improve(ch, gsn_pick_lock, true, 2);
		return;
	}

	auto door = find_door(ch, arg);
	if (door < 0)
		return;

	/* 'pick door' */
	auto pexit = ch->in_room->exit[door];
	if (!IS_SET(pexit->exit_info, EX_CLOSED) && !is_immortal(ch))
	{
		send_to_char("It's not closed.\n\r", ch);
		return;
	}

	if (pexit->key < 0 && !is_immortal(ch))
	{
		send_to_char("It can't be picked.\n\r", ch);
		return;
	}

	if (!IS_SET(pexit->exit_info, EX_LOCKED))
	{
		send_to_char("It's already unlocked.\n\r", ch);
		return;
	}

	if (IS_SET(pexit->exit_info, EX_PICKPROOF) && !is_immortal(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	REMOVE_BIT(pexit->exit_info, EX_LOCKED);

	send_to_char("*Click*\n\r", ch);
	act("$n picks the $T.", ch, nullptr, pexit->keyword, TO_ROOM);
	check_improve(ch, gsn_pick_lock, true, 2);

	/* pick the other side */
	auto to_room = pexit->u1.to_room;
	auto pexit_rev = to_room->exit[rev_dir[door]];
	if (to_room != nullptr && pexit_rev != nullptr && pexit_rev->u1.to_room == ch->in_room)
	{
		REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
	}
}